

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O1

void __thiscall Refal2::CModuleBuilder::SetEmpty(CModuleBuilder *this,CToken *nameToken)

{
  bool bVar1;
  TLabel function;
  CPreparatoryFunction *function_00;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = declare(this,nameToken);
    function_00 = getFunction(this,function);
    bVar1 = checkOnlyDeclared(this,function_00,nameToken);
    if (bVar1) {
      CPreparatoryFunction::SetDefined(function_00,nameToken);
      CPreparatoryFunction::SetEmpty(function_00);
      return;
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetEmpty( const CToken& nameToken )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		function.SetDefined( nameToken );
		function.SetEmpty();
	}
}